

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.cpp
# Opt level: O3

Result * __thiscall
CoreML::OneHotEncoder::setFeatureEncoding
          (Result *__return_storage_ptr__,OneHotEncoder *this,
          vector<long,_std::allocator<long>_> *container)

{
  Model *this_00;
  long *plVar1;
  long lVar2;
  OneHotEncoder *this_01;
  Int64Vector *this_02;
  int iVar3;
  long *plVar4;
  
  this_00 = (this->super_Model).m_spec.
            super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00->_oneof_case_[0] == 600) {
    this_01 = (this_00->Type_).onehotencoder_;
  }
  else {
    Specification::Model::clear_Type(this_00);
    this_00->_oneof_case_[0] = 600;
    this_01 = (OneHotEncoder *)operator_new(0x28);
    Specification::OneHotEncoder::OneHotEncoder(this_01);
    (this_00->Type_).onehotencoder_ = this_01;
  }
  if (this_01->_oneof_case_[0] == 2) {
    if ((this_01->CategoryType_).stringcategories_ != (StringVector *)0x0) {
      (*(((this_01->CategoryType_).stringcategories_)->super_MessageLite)._vptr_MessageLite[1])();
    }
    this_01->_oneof_case_[0] = 0;
  }
  plVar1 = (container->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (plVar4 = (container->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                super__Vector_impl_data._M_start; plVar4 != plVar1; plVar4 = plVar4 + 1) {
    lVar2 = *plVar4;
    if (this_01->_oneof_case_[0] == 2) {
      this_02 = (this_01->CategoryType_).int64categories_;
    }
    else {
      Specification::OneHotEncoder::clear_CategoryType(this_01);
      this_01->_oneof_case_[0] = 2;
      this_02 = (Int64Vector *)operator_new(0x28);
      Specification::Int64Vector::Int64Vector(this_02);
      (this_01->CategoryType_).int64categories_ = this_02;
    }
    iVar3 = (this_02->vector_).current_size_;
    if (iVar3 == (this_02->vector_).total_size_) {
      google::protobuf::RepeatedField<long>::Reserve(&this_02->vector_,iVar3 + 1);
      iVar3 = (this_02->vector_).current_size_;
    }
    (this_02->vector_).current_size_ = iVar3 + 1;
    ((this_02->vector_).rep_)->elements[iVar3] = lVar2;
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result OneHotEncoder::setFeatureEncoding(const std::vector<int64_t>& container) {
        auto ohe = m_spec->mutable_onehotencoder();
        ohe->clear_int64categories();

        for (auto element : container) {
            ohe->mutable_int64categories()->add_vector(element);
        }
        return Result();
    }